

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O2

void llvm::APInt::tcFullMultiply
               (WordType *dst,WordType *lhs,WordType *rhs,uint lhsParts,uint rhsParts)

{
  uint parts;
  WordType *pWVar1;
  long lVar2;
  
  do {
    parts = rhsParts;
    rhsParts = lhsParts;
    pWVar1 = lhs;
    lhs = rhs;
    rhs = pWVar1;
    lhsParts = parts;
  } while (parts < rhsParts);
  if ((pWVar1 != dst) && (lhs != dst)) {
    tcSet(dst,0,parts);
    for (lVar2 = 0; (ulong)rhsParts << 3 != lVar2; lVar2 = lVar2 + 8) {
      tcMultiplyPart((WordType *)((long)dst + lVar2),lhs,*(WordType *)((long)pWVar1 + lVar2),0,parts
                     ,parts + 1,true);
    }
    return;
  }
  __assert_fail("dst != lhs && dst != rhs",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APInt.cpp"
                ,0x9c2,
                "static void llvm::APInt::tcFullMultiply(WordType *, const WordType *, const WordType *, unsigned int, unsigned int)"
               );
}

Assistant:

void APInt::tcFullMultiply(WordType *dst, const WordType *lhs,
                           const WordType *rhs, unsigned lhsParts,
                           unsigned rhsParts) {
  /* Put the narrower number on the LHS for less loops below.  */
  if (lhsParts > rhsParts)
    return tcFullMultiply (dst, rhs, lhs, rhsParts, lhsParts);

  assert(dst != lhs && dst != rhs);

  tcSet(dst, 0, rhsParts);

  for (unsigned i = 0; i < lhsParts; i++)
    tcMultiplyPart(&dst[i], rhs, lhs[i], 0, rhsParts, rhsParts + 1, true);
}